

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::EnumDescriptor_const*,google::protobuf::EnumDescriptorProto_const&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  bool bVar1;
  EnumValueDescriptor *pEVar2;
  pointer prVar3;
  int j;
  int index;
  flat_hash_set<long,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  used;
  long local_148;
  AlphaNum local_140;
  AlphaNum local_110;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  local_e0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  local_e0.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       1;
  local_e0.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  for (index = 0; index < ((EnumDescriptor *)**(undefined8 **)this)->value_count_; index = index + 1
      ) {
    pEVar2 = google::protobuf::EnumDescriptor::value((EnumDescriptor *)**(undefined8 **)this,index);
    local_140.piece_._M_len = CONCAT44(local_140.piece_._M_len._4_4_,pEVar2->number_);
    container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
    ::emplace<int,_0>((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>::iterator,_bool>
                       *)&local_110,&local_e0,(int *)&local_140);
  }
  local_148 = (long)*(int *)(**(long **)(this + 8) + 4);
  do {
    local_148 = local_148 + 1;
    bVar1 = container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
            ::contains<long>(&local_e0,&local_148);
  } while (bVar1);
  local_110.piece_ = NullSafeStringView("\"");
  local_140.piece_._M_str = *(char **)(*(long *)(**(long **)(this + 8) + 8) + 0x20);
  local_140.piece_._M_len = *(size_t *)(*(long *)(**(long **)(this + 8) + 8) + 0x28);
  local_c0.piece_ = NullSafeStringView("\" uses the same enum value as \"");
  prVar3 = container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::iterator::operator->(*(iterator **)(this + 0x10));
  local_60.piece_._M_str = (prVar3->second)._M_dataplus._M_p;
  local_60.piece_._M_len = (prVar3->second)._M_string_length;
  local_90.piece_ =
       NullSafeStringView(
                         "\". If this is intended, set \'option allow_alias = true;\' to the enum definition."
                         );
  StrCat<>(__return_storage_ptr__,&local_110,&local_140,&local_c0,&local_60,&local_90);
  if (local_148 < 0x7fffffff) {
    local_110.piece_ = NullSafeStringView(" The next available enum value is ");
    AlphaNum::AlphaNum(&local_140,local_148);
    local_c0.piece_ = NullSafeStringView(".");
    StrAppend(__return_storage_ptr__,&local_110,&local_140,&local_c0);
  }
  container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<long>,_absl::lts_20250127::hash_internal::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  ::~raw_hash_set(&local_e0);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}